

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_scan.c
# Opt level: O2

void UNGET(int c,_PDCLIB_status_t *status)

{
  undefined1 auVar1 [16];
  long lVar2;
  long lVar3;
  
  if ((FILE *)status->stream == (FILE *)0x0) {
    status->s = status->s + -1;
  }
  else {
    ungetc(c,(FILE *)status->stream);
  }
  lVar2 = status->i - 1;
  lVar3 = status->current - 1;
  auVar1._8_4_ = (int)lVar3;
  auVar1._0_8_ = lVar2;
  auVar1._12_4_ = (int)((ulong)lVar3 >> 0x20);
  status->i = lVar2;
  status->current = auVar1._8_8_;
  return;
}

Assistant:

static void UNGET( int c, struct _PDCLIB_status_t * status )
{
    if ( status->stream != NULL )
    {
        ungetc( c, status->stream ); /* TODO: Error? */
    }
    else
    {
        --( status->s );
    }

    --( status->i );
    --( status->current );
}